

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void * cmAddSource(void *arg,void *arg2)

{
  value_type *pvVar1;
  mapped_type pcVar2;
  mapped_type *ppcVar3;
  string *d;
  value_type *__x;
  cmSourceFile *rsf;
  cmSourceFile *local_38;
  
  if (*(long *)((long)arg2 + 0x50) == 0) {
    pcVar2 = (mapped_type)0x0;
  }
  else {
    local_38 = cmMakefile::GetOrCreateSource
                         ((cmMakefile *)arg,(string *)((long)arg2 + 0x48),false,Ambiguous);
    if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)((long)arg2 + 0x80) !=
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)&local_38->Properties) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_38->Properties,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)arg2 + 0x80));
    }
    pvVar1 = *(value_type **)((long)arg2 + 0x70);
    for (__x = *(value_type **)((long)arg2 + 0x68); __x != pvVar1; __x = __x + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_38->Depends,__x);
    }
    pcVar2 = (mapped_type)operator_new(0xb8);
    pcVar2->RealSourceFile = (cmSourceFile *)0x0;
    (pcVar2->SourceName)._M_dataplus._M_p = (pointer)&(pcVar2->SourceName).field_2;
    (pcVar2->SourceName)._M_string_length = 0;
    (pcVar2->SourceName).field_2._M_local_buf[0] = '\0';
    (pcVar2->SourceExtension)._M_dataplus._M_p = (pointer)&(pcVar2->SourceExtension).field_2;
    (pcVar2->SourceExtension)._M_string_length = 0;
    (pcVar2->SourceExtension).field_2._M_local_buf[0] = '\0';
    (pcVar2->FullPath)._M_dataplus._M_p = (pointer)&(pcVar2->FullPath).field_2;
    (pcVar2->FullPath)._M_string_length = 0;
    (pcVar2->FullPath).field_2._M_local_buf[0] = '\0';
    (pcVar2->Depends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pcVar2->Depends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pcVar2->Depends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pcVar2->Properties).Map_._M_h._M_buckets = &(pcVar2->Properties).Map_._M_h._M_single_bucket;
    (pcVar2->Properties).Map_._M_h._M_bucket_count = 1;
    (pcVar2->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pcVar2->Properties).Map_._M_h._M_element_count = 0;
    (pcVar2->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pcVar2->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
    (pcVar2->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pcVar2->RealSourceFile = local_38;
    std::__cxx11::string::_M_assign((string *)&pcVar2->FullPath);
    std::__cxx11::string::_M_assign((string *)&pcVar2->SourceName);
    std::__cxx11::string::_M_assign((string *)&pcVar2->SourceExtension);
    ppcVar3 = std::
              map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              ::operator[](&cmCPluginAPISourceFiles.
                            super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                           ,&local_38);
    *ppcVar3 = pcVar2;
  }
  return pcVar2;
}

Assistant:

void* CCONV cmAddSource(void* arg, void* arg2)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmCPluginAPISourceFile* osf = static_cast<cmCPluginAPISourceFile*>(arg2);
  if (osf->FullPath.empty()) {
    return nullptr;
  }

  // Create the real cmSourceFile instance and copy over saved information.
  cmSourceFile* rsf = mf->GetOrCreateSource(osf->FullPath);
  rsf->GetProperties() = osf->Properties;
  for (std::string const& d : osf->Depends) {
    rsf->AddDepend(d);
  }

  // Create the proxy for the real source file.
  cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
  sf->RealSourceFile = rsf;
  sf->FullPath = osf->FullPath;
  sf->SourceName = osf->SourceName;
  sf->SourceExtension = osf->SourceExtension;

  // Store the proxy in the map so it can be re-used and deleted later.
  cmCPluginAPISourceFiles[rsf] = sf;
  return sf;
}